

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O1

ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_> *
getFileAux<llvm::MemoryBuffer>
          (ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
           *__return_storage_ptr__,Twine *Filename,int64_t FileSize,uint64_t MapSize,uint64_t Offset
          ,bool RequiresNullTerminator,bool IsVolatile)

{
  undefined8 in_RAX;
  error_code eVar1;
  int FD;
  
  FD = (int)((ulong)in_RAX >> 0x20);
  eVar1 = llvm::sys::fs::openFileForRead(Filename,&FD,F_None,(SmallVectorImpl<char> *)0x0);
  if (eVar1._M_value == 0) {
    getOpenFileImpl<llvm::MemoryBuffer>
              (__return_storage_ptr__,FD,Filename,FileSize,MapSize,Offset,RequiresNullTerminator,
               IsVolatile);
    close(FD);
  }
  else {
    __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 | 1;
    *(int *)&__return_storage_ptr__->field_0 = eVar1._M_value;
    *(error_category **)((long)&__return_storage_ptr__->field_0 + 8) = eVar1._M_cat;
  }
  return __return_storage_ptr__;
}

Assistant:

static ErrorOr<std::unique_ptr<MB>>
getFileAux(const Twine &Filename, int64_t FileSize, uint64_t MapSize,
           uint64_t Offset, bool RequiresNullTerminator, bool IsVolatile) {
  int FD;
  std::error_code EC = sys::fs::openFileForRead(Filename, FD, sys::fs::OF_None);

  if (EC)
    return EC;

  auto Ret = getOpenFileImpl<MB>(FD, Filename, FileSize, MapSize, Offset,
                                 RequiresNullTerminator, IsVolatile);
  close(FD);
  return Ret;
}